

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forms_compatability.cxx
# Opt level: O3

void fl_initialize(int *argc,char **argv,char *param_3,void *param_4,int param_5)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  uint argc_00;
  int local_2c;
  
  argc_00 = *argc;
  uVar5 = 0xffffffffffffffff;
  if (-2 < (int)argc_00) {
    uVar5 = (long)(int)(argc_00 + 1) << 3;
  }
  initargc = argc_00;
  initargv = (char **)operator_new__(uVar5);
  iVar4 = 1;
  if (-1 < (int)argc_00) {
    memcpy(initargv,argv,(ulong)(argc_00 + 1) << 3);
    local_2c = 1;
    if (1 < argc_00) {
      iVar4 = 1;
      do {
        iVar1 = Fl::arg(argc_00,argv,&local_2c);
        if (iVar1 == 0) {
          lVar2 = (long)local_2c;
          local_2c = local_2c + 1;
          lVar3 = (long)iVar4;
          iVar4 = iVar4 + 1;
          argv[lVar3] = argv[lVar2];
        }
        argc_00 = *argc;
      } while (local_2c < (int)argc_00);
    }
  }
  argv[iVar4] = (char *)0x0;
  *argc = iVar4;
  if (fl_flip == '\x02') {
    fl_flip = '\0';
  }
  return;
}

Assistant:

void fl_initialize(int *argc, char **argv, const char *, FL_CMD_OPT *, int) {
  initargc = *argc;
  initargv = new char*[*argc+1];
  int i,j;
  for (i=0; i<=*argc; i++) initargv[i] = argv[i];
  for (i=j=1; i<*argc; ) {
    if (Fl::arg(*argc,argv,i));
    else argv[j++] = argv[i++];
  }
  argv[j] = 0;
  *argc = j;
  if (fl_flip==2) fl_flip = 0;
}